

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawSimpleTest.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_9::SimpleDraw::iterate(TestStatus *__return_storage_ptr__,SimpleDraw *this)

{
  VkPrimitiveTopology VVar1;
  DeviceInterface *pDVar2;
  VkCommandBuffer_s *pVVar3;
  VkOffset3D offset;
  qpTestResult code;
  bool bVar4;
  VkResult VVar5;
  int iVar6;
  int iVar7;
  TestContext *this_00;
  TestLog *log_00;
  VkQueue queue_00;
  Buffer *this_01;
  VkCommandBuffer_s **ppVVar8;
  Handle<(vk::HandleType)18> *pHVar9;
  PixelBufferAccess *pPVar10;
  Image *this_02;
  Allocator *allocator;
  ConstPixelBufferAccess *reference;
  char *__s;
  Move<vk::VkCommandBuffer_s_*> *pMVar11;
  float fVar12;
  float fVar13;
  allocator<char> local_1c1;
  string local_1c0;
  qpTestResult local_19c;
  void *pvStack_198;
  qpTestResult res;
  deInt32 local_190;
  undefined1 local_188 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  int local_13c;
  float xCoord;
  int x;
  float yCoord;
  int y;
  ReferenceImageCoordinates refCoords;
  deInt32 frameHeight;
  deInt32 frameWidth;
  TextureFormat local_e8;
  undefined1 local_e0 [8];
  Texture2D referenceFrame;
  undefined8 uStack_88;
  VkSubmitInfo submitInfo;
  deUint64 local_38;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkQueue queue;
  TestLog *log;
  SimpleDraw *this_local;
  
  this_00 = Context::getTestContext((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  log_00 = tcu::TestContext::getLog(this_00);
  queue_00 = Context::getUniversalQueue
                       ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  DrawTestsBaseClass::beginRenderPass(&this->super_DrawTestsBaseClass);
  vertexBuffer.m_internal = 0;
  this_01 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DrawTestsBaseClass).m_vertexBuffer);
  local_38 = (deUint64)Draw::Buffer::object(this_01);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  pMVar11 = &(this->super_DrawTestsBaseClass).m_cmdBuffer;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&pMVar11->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x58])(pDVar2,*ppVVar8,0,1,&local_38,&vertexBuffer);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&pMVar11->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = *ppVVar8;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DrawTestsBaseClass).m_pipeline.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  submitInfo.pSignalSemaphores = (VkSemaphore *)pHVar9->m_internal;
  (*pDVar2->_vptr_DeviceInterface[0x4c])(pDVar2,pVVar3,0,submitInfo.pSignalSemaphores);
  VVar1 = (this->super_DrawTestsBaseClass).m_topology;
  if (VK_PRIMITIVE_TOPOLOGY_LINE_STRIP < VVar1) {
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
      ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                          (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>);
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,*ppVVar8,6,1,2,0);
    }
    else if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
      ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                          (&(this->super_DrawTestsBaseClass).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>);
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,*ppVVar8,4,1,2,0);
    }
  }
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  pMVar11 = &(this->super_DrawTestsBaseClass).m_cmdBuffer;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&pMVar11->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x76])(pDVar2,*ppVVar8);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&pMVar11->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar2->_vptr_DeviceInterface[0x4a])(pDVar2,*ppVVar8);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_88 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&pMVar11->super_RefBase<vk::VkCommandBuffer_s_*>);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  VVar5 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,queue_00,1,&uStack_88);
  ::vk::checkResult(VVar5,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawSimpleTest.cpp"
                    ,0xa2);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  VVar5 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,queue_00);
  ::vk::checkResult(VVar5,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawSimpleTest.cpp"
                    ,0xa4);
  local_e8 = ::vk::mapVkFormat((this->super_DrawTestsBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_e0,&local_e8,0x100,0x100);
  tcu::Texture2D::allocLevel((Texture2D *)local_e0,0);
  iVar6 = tcu::Texture2D::getWidth((Texture2D *)local_e0);
  iVar7 = tcu::Texture2D::getHeight((Texture2D *)local_e0);
  pPVar10 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_e0,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&refCoords.bottom + 4),0.0,0.0,0.0,1.0);
  tcu::clear(pPVar10,(Vec4 *)((long)&refCoords.bottom + 4));
  ReferenceImageCoordinates::ReferenceImageCoordinates((ReferenceImageCoordinates *)&yCoord);
  for (x = 0; x < iVar7; x = x + 1) {
    fVar12 = (float)x / ((float)iVar7 * 0.5) - 1.0;
    for (local_13c = 0; local_13c < iVar6; local_13c = local_13c + 1) {
      fVar13 = (float)local_13c / ((float)iVar6 * 0.5) - 1.0;
      if ((((refCoords.top <= (double)fVar12) && ((double)fVar12 <= refCoords.right)) &&
          (_yCoord <= (double)fVar13)) && ((double)fVar13 <= refCoords.left)) {
        pPVar10 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_e0,0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zeroOffset.z,0.0,0.0,1.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar10,(Vec4 *)&zeroOffset.z,local_13c,x,0);
      }
    }
  }
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_02 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DrawTestsBaseClass).m_colorTargetImage);
  allocator = Context::getDefaultAllocator
                        ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  local_190 = zeroOffset.x;
  pvStack_198 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_188,this_02,queue_00,allocator,VK_IMAGE_LAYOUT_GENERAL,
             offset,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  local_19c = QP_TEST_RESULT_PASS;
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_e0,0)->
               super_ConstPixelBufferAccess;
  bVar4 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_188,0.05,COMPARE_LOG_RESULT);
  if (!bVar4) {
    local_19c = QP_TEST_RESULT_FAIL;
  }
  code = local_19c;
  __s = qpGetTestResultName(local_19c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,__s,&local_1c1);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  tcu::Texture2D::~Texture2D((Texture2D *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SimpleDraw::iterate (void)
{
	tcu::TestLog &log							= m_context.getTestContext().getLog();
	const vk::VkQueue queue						= m_context.getUniversalQueue();

	beginRenderPass();

	const vk::VkDeviceSize vertexBufferOffset	= 0;
	const vk::VkBuffer vertexBuffer				= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_vk.cmdDraw(*m_cmdBuffer, 6, 1, 2, 0);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 2, 0);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));

	referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageCoordinates refCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refCoords.bottom	&&
				 yCoord <= refCoords.top	&&
				 xCoord >= refCoords.left	&&
				 xCoord <= refCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

}